

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::resize
          (SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL> *this,size_t new_size)

{
  ulong local_28;
  size_t i_1;
  size_t i;
  size_t new_size_local;
  SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL> *this_local;
  
  i_1 = new_size;
  if (new_size < (this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).buffer_size) {
    for (; i_1 < (this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).buffer_size;
        i_1 = i_1 + 1) {
    }
  }
  else if ((this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).buffer_size < new_size) {
    reserve(this,new_size);
    for (local_28 = (this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).buffer_size;
        local_28 < new_size; local_28 = local_28 + 1) {
      (this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).ptr[local_28] =
           (SPIRConstant *)0x0;
    }
  }
  (this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}